

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderPacketWindow::RemoveElements(EncoderPacketWindow *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  reference pvVar5;
  OutputWorker *in_RDI;
  uint laneIndex_2;
  uint laneIndex_1;
  uint originalBytes;
  OriginalPacket *original;
  uint count;
  uint i;
  uint laneLongest [8];
  uint longestPacket;
  uint subwindowsShifted;
  uint sumIndex;
  uint laneIndex;
  uint removedElementCount;
  uint firstKeptSubwindow;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffb08;
  LogStringBuffer *in_stack_fffffffffffffb10;
  EncoderPacketWindow *in_stack_fffffffffffffb18;
  EncoderPacketWindow *in_stack_fffffffffffffb20;
  EncoderPacketWindow *in_stack_fffffffffffffb28;
  LogStringBuffer *buffer_00;
  uint local_4a4;
  uint local_48c;
  uint local_488 [8];
  uint local_468;
  uint in_stack_fffffffffffffb9c;
  uint uVar6;
  uint laneIndex_00;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  uint *local_1a8;
  char *local_1a0;
  uint *local_198;
  char *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  uint *local_178;
  char *local_170;
  uint *local_168;
  char *local_160;
  undefined *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined *local_128;
  undefined1 *local_120;
  uint *local_118;
  char *local_110;
  uint *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  uint *local_c0;
  char *local_b8;
  uint *local_b0;
  undefined1 *local_a8;
  EncoderPacketWindow *local_a0;
  uint *local_98;
  undefined1 *local_90;
  EncoderPacketWindow *local_88;
  uint *local_80;
  undefined1 *local_78;
  uint *local_70;
  char *local_68;
  undefined1 *local_60;
  EncoderPacketWindow *local_58;
  uint *local_50;
  undefined1 *local_48;
  EncoderPacketWindow *local_40;
  uint *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  EncoderPacketWindow *local_18;
  char *local_10;
  undefined1 *local_8;
  
  uVar3 = *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x20) >> 6;
  uVar4 = uVar3 << 6;
  buffer_00 = (LogStringBuffer *)&Logger;
  if (DAT_0034fe68 < 3) {
    local_180 = &Logger;
    local_184 = 2;
    local_190 = "******** Removing up to ";
    local_1a0 = " and startColumn=";
    local_1a8 = (uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x18);
    local_198 = (uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x20);
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,Trace);
    local_158 = &DAT_0034fe98;
    local_148 = &Logger;
    local_160 = local_190;
    local_168 = local_198;
    local_170 = local_1a0;
    local_178 = local_1a8;
    local_130 = &Logger;
    local_150 = local_330;
    local_140 = local_158;
    local_138 = local_330;
    local_128 = local_158;
    local_120 = local_330;
    std::operator<<(aoStack_320,(string *)&DAT_0034fe98);
    local_f0 = &Logger;
    local_f8 = local_150;
    local_100 = local_160;
    local_108 = local_168;
    local_110 = local_170;
    local_118 = local_178;
    in_stack_fffffffffffffb18 = (EncoderPacketWindow *)&Logger;
    local_d8 = &Logger;
    local_e0 = local_150;
    local_e8 = local_160;
    local_c8 = local_150;
    local_d0 = local_160;
    std::operator<<((ostream *)(local_150 + 0x10),local_160);
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_90 = local_f8;
    local_98 = local_108;
    local_78 = local_f8;
    local_80 = local_108;
    in_stack_fffffffffffffb28 = in_stack_fffffffffffffb18;
    local_a0 = in_stack_fffffffffffffb18;
    local_88 = in_stack_fffffffffffffb18;
    std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_20 = local_a8;
    local_28 = local_b8;
    local_8 = local_a8;
    local_10 = local_b8;
    in_stack_fffffffffffffb20 = in_stack_fffffffffffffb18;
    local_58 = in_stack_fffffffffffffb18;
    local_18 = in_stack_fffffffffffffb18;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_48 = local_60;
    local_50 = local_70;
    local_30 = local_60;
    local_38 = local_70;
    local_40 = in_stack_fffffffffffffb18;
    std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
    in_stack_fffffffffffffb10 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_RDI,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x24b512);
  }
  uVar6 = (uint)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  if (*(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24) <
      (uint)(in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock) {
    for (laneIndex_00 = 0; uVar6 = (uint)((ulong)in_stack_fffffffffffffb20 >> 0x20),
        laneIndex_00 < 8; laneIndex_00 = laneIndex_00 + 1) {
      for (uVar6 = 0; uVar6 < 3; uVar6 = uVar6 + 1) {
        GetSum((EncoderPacketWindow *)CONCAT44(uVar3,uVar4),laneIndex_00,uVar6,
               in_stack_fffffffffffffb9c);
        lVar1 = (ulong)laneIndex_00 * 0x48 + 0x118;
        *(uint *)((long)&in_RDI[1].StartStopLock + (ulong)uVar6 * 4 + lVar1 + -0x100) =
             *(int *)((long)&in_RDI[1].StartStopLock + (ulong)uVar6 * 4 + lVar1 + -0x100) - uVar4;
      }
    }
    if (*(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24) < uVar4) {
      (in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__owner =
           (uVar4 - *(int *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24)) +
           (in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__owner;
    }
    if (uVar4 < (uint)(in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock) {
      (in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock =
           (in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock - uVar4;
    }
    else {
      (in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock = 0;
    }
    if (uVar4 < *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24)) {
      *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24) =
           *(int *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24) - uVar4;
    }
    else {
      *(undefined4 *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24) = 0;
    }
  }
  bVar2 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
                    ((LightVector<siamese::EncoderSubwindow_*,_25U> *)in_stack_fffffffffffffb28,
                     uVar6);
  if (bVar2) {
    memcpy((void *)in_RDI[4].QueueLock.super___mutex_base._M_mutex.__align,
           *(void **)((long)&in_RDI[1].StartStopLock.super___mutex_base._M_mutex + 8),
           (ulong)uVar3 << 3);
    uVar6 = in_RDI[1].StartStopLock.super___mutex_base._M_mutex.__data.__lock - uVar3;
    memmove(*(void **)((long)&in_RDI[1].StartStopLock.super___mutex_base._M_mutex + 8),
            (void *)(*(long *)((long)&in_RDI[1].StartStopLock.super___mutex_base._M_mutex + 8) +
                    (long)(int)uVar3 * 8),(ulong)uVar6 << 3);
    memcpy((void *)(*(long *)((long)&in_RDI[1].StartStopLock.super___mutex_base._M_mutex + 8) +
                   (long)(int)uVar6 * 8),
           (void *)in_RDI[4].QueueLock.super___mutex_base._M_mutex.__align,(ulong)uVar3 << 3);
    *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x14) =
         *(int *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x14) - uVar4;
    *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x18) =
         uVar4 + *(int *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x18) &
         0x3fffff;
    *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x20) =
         *(int *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x20) - uVar4;
    local_468 = 0;
    memset(local_488,0,0x20);
    uVar3 = *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x14);
    for (local_48c = *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x20);
        local_48c < uVar3; local_48c = local_48c + 1) {
      pvVar5 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                         ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffffb10,
                          (size_type)in_stack_fffffffffffffb08);
      uVar4 = (pvVar5->Buffer).Bytes;
      if (local_468 < uVar4) {
        local_468 = uVar4;
      }
      if (local_488[local_48c & 7] < uVar4) {
        local_488[local_48c & 7] = uVar4;
      }
    }
    *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x1c) = local_468;
    for (local_4a4 = 0; local_4a4 < 8; local_4a4 = local_4a4 + 1) {
      *(uint *)(&in_RDI[1].field_0x58 + (ulong)local_4a4 * 0x48) = local_488[local_4a4];
    }
    if ((uint)(in_RDI->QueueLock).super___mutex_base._M_mutex.__data.__lock <=
        *(uint *)((long)&(in_RDI->StartStopLock).super___mutex_base._M_mutex + 0x24)) {
      ResetSums(in_stack_fffffffffffffb18,(uint)((ulong)in_stack_fffffffffffffb10 >> 0x20));
    }
  }
  else {
    in_RDI[4].QueueLock.super___mutex_base._M_mutex.__size[0x10] = '\x01';
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveElements()
{
    const unsigned firstKeptSubwindow  = FirstUnremovedElement / kSubwindowSize;
    const unsigned removedElementCount = firstKeptSubwindow * kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow >= 1);
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow < Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(removedElementCount % kColumnLaneCount == 0);
    SIAMESE_DEBUG_ASSERT(removedElementCount <= FirstUnremovedElement);

    Logger.Info("******** Removing up to ", FirstUnremovedElement, " and startColumn=", ColumnStart);

    // If there are running sums:
    if (SumEndElement > SumStartElement)
    {
        // Roll up the sums past the removal point
        for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
        {
            for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
            {
                GetSum(laneIndex, sumIndex, removedElementCount);

                SIAMESE_DEBUG_ASSERT(Lanes[laneIndex].NextElement[sumIndex] >= removedElementCount);
                Lanes[laneIndex].NextElement[sumIndex] -= removedElementCount;
            }
        }

        if (removedElementCount > SumStartElement) {
            SumErasedCount += removedElementCount - SumStartElement;
        }

        if (SumEndElement > removedElementCount) {
            SumEndElement -= removedElementCount;
        }
        else {
            SumEndElement = 0;
        }

        if (SumStartElement > removedElementCount) {
            SumStartElement -= removedElementCount;
        }
        else {
            SumStartElement = 0;
        }
    }

    // Shift kept subwindows to the front of the vector:

    // Resize a temporary buffer for removed subwindows
    if (!SubwindowsShift.SetSize_NoCopy(firstKeptSubwindow))
    {
        SIAMESE_DEBUG_BREAK(); // OOM
        EmergencyDisabled = true;
        return;
    }

    // Store removed subwindows temporarily
    memcpy(
        SubwindowsShift.GetPtr(0),
        Subwindows.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    const unsigned subwindowsShifted = Subwindows.GetSize() - firstKeptSubwindow;

    // Shift subwindows to front that are being kept
    memmove(
        Subwindows.GetPtr(0),
        Subwindows.GetPtr(firstKeptSubwindow),
        subwindowsShifted * sizeof(EncoderSubwindow*)
    );

    // Removed subwindows are moved to the end (unordered) for later reuse
    memcpy(
        Subwindows.GetPtr(subwindowsShifted),
        SubwindowsShift.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    // Update the count of elements in the window
    SIAMESE_DEBUG_ASSERT(Count >= removedElementCount);
    Count -= removedElementCount;

    // Roll up the ColumnStart member
    ColumnStart = ElementToColumn(removedElementCount);
    SIAMESE_DEBUG_ASSERT(ColumnStart == Subwindows.GetRef(0)->Originals[0].Column);

    // Roll up the FirstUnremovedElement member
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement % kSubwindowSize == FirstUnremovedElement - removedElementCount);
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement >= removedElementCount);
    FirstUnremovedElement -= removedElementCount;

    // Determine the new longest packets
    unsigned longestPacket = 0;
    unsigned laneLongest[kColumnLaneCount] = { 0 };
    for (unsigned i = FirstUnremovedElement, count = Count; i < count; ++i)
    {
        OriginalPacket* original     = GetWindowElement(i);
        const unsigned originalBytes = original->Buffer.Bytes;
        if (longestPacket < originalBytes) {
            longestPacket = originalBytes;
        }
        SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == i % kColumnLaneCount);
        const unsigned laneIndex = i % kColumnLaneCount;
        if (laneLongest[laneIndex] < originalBytes) {
            laneLongest[laneIndex] = originalBytes;
        }
    }

    // Update longest packet fields
    LongestPacket = longestPacket;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = laneLongest[laneIndex];
    }

    // If there are no running sums:
    if (SumEndElement <= SumStartElement) {
        ResetSums(FirstUnremovedElement);
    }
}